

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O2

rgba_vec_t *
sfc::unpack_native_colors(rgba_vec_t *__return_storage_ptr__,byte_vec_t *colors,Mode mode)

{
  pointer puVar1;
  runtime_error *this;
  pointer puVar2;
  byte bVar3;
  int iVar4;
  uint i;
  uint uVar5;
  long lVar6;
  rgba_t nc;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(mode) {
  case snes:
  case snes_mode7:
  case gbc:
  case gba:
  case gba_affine:
    puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((int)puVar2 - (int)puVar1 & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
LAB_0013a23b:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (uVar5 = 1; (ulong)(uVar5 - 1) < (ulong)((long)puVar2 - (long)puVar1); uVar5 = uVar5 + 2) {
      nc = (((uint)puVar1[uVar5] * 0x800 + (uint)puVar1[uVar5 - 1] * 8 & 0x1f00) +
           (((uint)puVar1[uVar5] << 0xe | (uint)puVar1[uVar5 - 1]) & 0x1f001f)) - 0x1000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    break;
  case gb:
    if ((long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not one byte");
      goto LAB_0013a23b;
    }
    for (iVar4 = 0; iVar4 != 8; iVar4 = iVar4 + 2) {
      switch(*(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start >> ((byte)iVar4 & 0x1f) & 3) {
      case 0:
        nc = 0xff030303;
        break;
      case 1:
        nc = 0xff020202;
        break;
      case 2:
        nc = 0xff010101;
        break;
      case 3:
        nc = 0xff000000;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
    }
    break;
  case md:
    puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((int)puVar2 - (int)puVar1 & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_0013a23b;
    }
    for (uVar5 = 1; (ulong)(uVar5 - 1) < (ulong)((long)puVar2 - (long)puVar1); uVar5 = uVar5 + 2) {
      nc = ((uint)puVar1[uVar5] * 0x8000 + (uint)puVar1[uVar5 - 1] * 8 |
           (uint)(puVar1[uVar5 - 1] >> 1)) & 0x70707 | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    break;
  case pce:
  case pce_sprite:
    puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((int)puVar2 - (int)puVar1 & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_0013a23b;
    }
    for (uVar5 = 1; (ulong)(uVar5 - 1) < (ulong)((long)puVar2 - (long)puVar1); uVar5 = uVar5 + 2) {
      nc = ((uint)puVar1[uVar5 - 1] << 8 | (uint)puVar1[uVar5] << 0x12 |
           (uint)(puVar1[uVar5 - 1] >> 3)) & 0x700707 | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    break;
  case ws:
    if ((long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not two bytes");
      goto LAB_0013a23b;
    }
    bVar3 = 0;
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      nc = (~(uint)((colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar5 >> 1] >> (bVar3 & 4)) & 7) *
           0x10101 | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      bVar3 = bVar3 + 4;
    }
    break;
  case wsc:
  case wsc_packed:
    puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((int)puVar2 - (int)puVar1 & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_0013a23b;
    }
    for (uVar5 = 1; (ulong)(uVar5 - 1) < (ulong)((long)puVar2 - (long)puVar1); uVar5 = uVar5 + 2) {
      nc = ((uint)puVar1[uVar5 - 1] << 0x10 | (uint)puVar1[uVar5 - 1] << 4 | (uint)puVar1[uVar5]) &
           0xf0f0f | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    break;
  case ngp:
    if ((long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 4) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not four bytes");
      goto LAB_0013a23b;
    }
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      nc = (~(uint)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar6] & 7) * 0x10101 | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
    }
    break;
  case ngpc:
    puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((int)puVar2 - (int)puVar1 & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_0013a23b;
    }
    for (uVar5 = 1; (ulong)(uVar5 - 1) < (ulong)((long)puVar2 - (long)puVar1); uVar5 = uVar5 + 2) {
      nc = ((uint)puVar1[uVar5 - 1] << 4 | (uint)puVar1[uVar5] << 0x10 | (uint)puVar1[uVar5 - 1]) &
           0xf0f0f | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    break;
  case sms:
    uVar5 = 0;
    while( true ) {
      puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)uVar5)
      break;
      bVar3 = puVar1[uVar5];
      nc = ((bVar3 & 0x30) * 0x1000 + ((bVar3 & 0xc) << 6 | bVar3 & 3)) - 0x1000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      uVar5 = uVar5 + 1;
    }
    break;
  case gg:
    puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((int)puVar2 - (int)puVar1 & 1U) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"native palette size not a multiple of 2");
      goto LAB_0013a23b;
    }
    for (uVar5 = 1; (ulong)(uVar5 - 1) < (ulong)((long)puVar2 - (long)puVar1); uVar5 = uVar5 + 2) {
      nc = ((uint)puVar1[uVar5 - 1] << 4 | (uint)puVar1[uVar5] << 0x10 | (uint)puVar1[uVar5 - 1]) &
           0xf0f0f | 0xff000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&nc);
      puVar1 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (colors->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline rgba_vec_t unpack_native_colors(const byte_vec_t& colors, Mode mode) {
  rgba_vec_t v;
  switch (mode) {
  case Mode::snes:
  case Mode::snes_mode7:
  case Mode::gbc:
  case Mode::gba:
  case Mode::gba_affine:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = (cw & 0x001f) | ((cw & 0x03e0) << 3) | ((cw & 0x7c00) << 6) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::sms:
    for (unsigned i = 0; i < colors.size(); i++) {
      rgba_t nc = (colors[i] & 3) | ((colors[i] & 0xC) << 6) | ((colors[i] & 0x30) << 12) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::gb:
    if (colors.size() != 1) {
      throw std::runtime_error("native palette size not one byte");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      switch ((colors[0] >> (i * 2)) & 0x3) {
        case 0: rgba = 0xff030303; break;
        case 1: rgba = 0xff020202; break;
        case 2: rgba = 0xff010101; break;
        case 3: rgba = 0xff000000; break;
        default:
          rgba = 0;
      }
      v.push_back(rgba);
    }
    break;
  case Mode::gg:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = (cw & 0x00f) | ((cw & 0x00f0) << 4) | ((cw & 0x0f00) << 8) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::md:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = ((cw & 0x00e) >> 1) | ((cw & 0x00e0) << 3) | ((cw & 0x0e00) << 7) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::pce:
  case Mode::pce_sprite:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = ((cw & 0x0038) >> 3) | ((cw & 0x0007) << 8) | ((cw & 0x1c00) << 10) | 0xff000000;
      v.push_back(nc);
    }
    break;
  case Mode::ws:
    // TODO: WonderSwan technically supports 8 out of 16 gray shades.
    // Currently, we do not support this additional distinction.
    if (colors.size() != 2) {
      throw std::runtime_error("native palette size not two bytes");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      uint32_t c = (colors[i >> 1] >> ((i & 0x01) * 4)) & 0x7;
      rgba = 0xff000000 | ((c ^ 0x7) * 0x10101);
      v.push_back(rgba);
    }
    break;
  case Mode::ngp:
    if (colors.size() != 4) {
      throw std::runtime_error("native palette size not four bytes");
    }
    for (unsigned i = 0; i < 4; ++i) {
      rgba_t rgba;
      uint32_t c = colors[i] & 0x7;
      rgba = 0xff000000 | ((c ^ 0x7) * 0x10101);
      v.push_back(rgba);
    }
    break;
  case Mode::wsc:
  case Mode::wsc_packed:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = 0xff000000 | ((cw & 0xf00) >> 8) | ((cw & 0xf0) << 4) | ((cw & 0xf) << 16);
      v.push_back(nc);
    }
    break;
  case Mode::ngpc:
    if (colors.size() % 2 != 0) {
      throw std::runtime_error("native palette size not a multiple of 2");
    }
    for (unsigned i = 0; i < colors.size(); i += 2) {
      uint16_t cw = (colors[i + 1] << 8) + colors[i];
      rgba_t nc = 0xff000000 | (cw & 0xf) | ((cw & 0xf0) << 4) | ((cw & 0xf00) << 8);
      v.push_back(nc);
    }
    break;
  case Mode::none:
    break;
  }
  return v;
}